

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

int lest::run<3ul>(test (*specification) [3],texts *arguments,ostream *os)

{
  int iVar1;
  texts *__first;
  test *__last;
  int *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  allocator<lest::test> local_41;
  tests local_40;
  int local_24;
  ostream *local_20;
  ostream *os_local;
  texts *arguments_local;
  test (*specification_local) [3];
  
  local_20 = os;
  os_local = (ostream *)arguments;
  arguments_local = (texts *)specification;
  std::ios_base::sync_with_stdio(false);
  __first = arguments_local;
  __last = (test *)(arguments_local + 8);
  std::allocator<lest::test>::allocator(&local_41);
  std::vector<lest::test,std::allocator<lest::test>>::vector<lest::test_const*,void>
            ((vector<lest::test,std::allocator<lest::test>> *)&local_40,(test *)__first,__last,
             &local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_70,arguments);
  local_24 = run(&local_40,&local_70,local_20);
  piVar2 = std::min<int>(&local_24,&exit_max_value);
  iVar1 = *piVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  std::allocator<lest::test>::~allocator(&local_41);
  return iVar1;
}

Assistant:

int run( test const (&specification)[N], texts arguments, std::ostream & os = std::cout )
{
    std::cout.sync_with_stdio( false );
    return (std::min)( run( tests( specification, specification + N ), arguments, os  ), exit_max_value );
}